

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

void Ivy_CutCompactAll(Ivy_Store_t *pCutStore)

{
  Ivy_Cut_t *__src;
  int local_20;
  int local_1c;
  int k;
  int i;
  Ivy_Cut_t *pCut;
  Ivy_Store_t *pCutStore_local;
  
  pCutStore->nCutsM = 0;
  local_20 = 0;
  for (local_1c = 0; local_1c < pCutStore->nCuts; local_1c = local_1c + 1) {
    __src = pCutStore->pCuts + local_1c;
    if (__src->nSize != 0) {
      if (__src->nSize < __src->nSizeMax) {
        pCutStore->nCutsM = pCutStore->nCutsM + 1;
      }
      memcpy(pCutStore->pCuts + local_20,__src,0x24);
      local_20 = local_20 + 1;
    }
  }
  pCutStore->nCuts = local_20;
  return;
}

Assistant:

void Ivy_CutCompactAll( Ivy_Store_t * pCutStore )
{
    Ivy_Cut_t * pCut;
    int i, k;
    pCutStore->nCutsM = 0;
    for ( i = k = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize < pCut->nSizeMax )
            pCutStore->nCutsM++;
        pCutStore->pCuts[k++] = *pCut;
    }
    pCutStore->nCuts = k;
}